

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_closed_set_normalizer.cc
# Opt level: O0

void __thiscall
s2builderutil::ClosedSetNormalizer::ClosedSetNormalizer
          (ClosedSetNormalizer *this,Options *options,
          vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>
          *graph_options_out)

{
  EdgeType EVar1;
  SiblingPairs SVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  vector<int,_std::allocator<int>_> *local_110;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_d8;
  int local_b0;
  int dim;
  S2LogMessageVoidify local_92;
  byte local_91;
  S2LogMessage local_90;
  S2LogMessageVoidify local_7a;
  byte local_79;
  S2LogMessage local_78;
  S2LogMessageVoidify local_62;
  byte local_61;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4a;
  byte local_49;
  S2LogMessage local_48;
  S2LogMessageVoidify local_35;
  int local_34;
  int local_30 [4];
  vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_> *local_20;
  vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_> *graph_options_out_local
  ;
  Options *options_local;
  ClosedSetNormalizer *this_local;
  
  this->options_ = *options;
  local_20 = graph_options_out;
  graph_options_out_local =
       (vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_> *)options;
  options_local = &this->options_;
  std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::vector
            (&this->graph_options_out_,graph_options_out);
  std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::vector
            (&this->graph_options_in_,&this->graph_options_out_);
  local_30[0] = std::numeric_limits<int>::max();
  local_34 = std::numeric_limits<int>::max();
  std::pair<int,_int>::pair<int,_int,_true>(&this->sentinel_,local_30,&local_34);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->is_suppressed_);
  std::vector<int,_std::allocator<int>_>::vector(&this->in_edges2_);
  std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::vector(&this->new_graphs_);
  local_d8 = this->new_edges_;
  do {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector(local_d8);
    local_d8 = local_d8 + 1;
  } while ((vector<int,_std::allocator<int>_> *)local_d8 != this->new_input_edge_ids_);
  local_110 = this->new_input_edge_ids_;
  do {
    std::vector<int,_std::allocator<int>_>::vector(local_110);
    local_110 = local_110 + 1;
  } while ((IdSetLexicon *)local_110 != &this->new_input_edge_id_set_lexicon_);
  IdSetLexicon::IdSetLexicon(&this->new_input_edge_id_set_lexicon_);
  sVar3 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::size
                    (&this->graph_options_out_);
  local_49 = 0;
  if (sVar3 != 3) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_closed_set_normalizer.cc"
               ,0x32,kFatal,(ostream *)&std::cerr);
    local_49 = 1;
    poVar5 = S2LogMessage::stream(&local_48);
    poVar5 = std::operator<<(poVar5,"Check failed: (graph_options_out_.size()) == (3) ");
    S2LogMessageVoidify::operator&(&local_35,poVar5);
  }
  if ((local_49 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
  }
  pvVar4 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::
           operator[](&this->graph_options_out_,0);
  local_61 = 0;
  EVar1 = S2Builder::GraphOptions::edge_type(pvVar4);
  if (EVar1 != DIRECTED) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_closed_set_normalizer.cc"
               ,0x33,kFatal,(ostream *)&std::cerr);
    local_61 = 1;
    poVar5 = S2LogMessage::stream(&local_60);
    poVar5 = std::operator<<(poVar5,
                             "Check failed: graph_options_out_[0].edge_type() == EdgeType::DIRECTED "
                            );
    S2LogMessageVoidify::operator&(&local_4a,poVar5);
  }
  if ((local_61 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
  }
  pvVar4 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::
           operator[](&this->graph_options_out_,2);
  local_79 = 0;
  EVar1 = S2Builder::GraphOptions::edge_type(pvVar4);
  if (EVar1 != DIRECTED) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_closed_set_normalizer.cc"
               ,0x34,kFatal,(ostream *)&std::cerr);
    local_79 = 1;
    poVar5 = S2LogMessage::stream(&local_78);
    poVar5 = std::operator<<(poVar5,
                             "Check failed: graph_options_out_[2].edge_type() == EdgeType::DIRECTED "
                            );
    S2LogMessageVoidify::operator&(&local_62,poVar5);
  }
  if ((local_79 & 1) == 0) {
    pvVar4 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::
             operator[](&this->graph_options_out_,1);
    local_91 = 0;
    SVar2 = S2Builder::GraphOptions::sibling_pairs(pvVar4);
    if (SVar2 == CREATE) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_closed_set_normalizer.cc"
                 ,0x39,kFatal,(ostream *)&std::cerr);
      local_91 = 1;
      poVar5 = S2LogMessage::stream(&local_90);
      poVar5 = std::operator<<(poVar5,
                               "Check failed: graph_options_out_[1].sibling_pairs() != SiblingPairs::CREATE "
                              );
      S2LogMessageVoidify::operator&(&local_7a,poVar5);
    }
    if ((local_91 & 1) == 0) {
      pvVar4 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::
               operator[](&this->graph_options_out_,1);
      SVar2 = S2Builder::GraphOptions::sibling_pairs(pvVar4);
      if (SVar2 == REQUIRE) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&dim,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_closed_set_normalizer.cc"
                   ,0x3a,kFatal,(ostream *)&std::cerr);
        poVar5 = S2LogMessage::stream((S2LogMessage *)&dim);
        poVar5 = std::operator<<(poVar5,
                                 "Check failed: graph_options_out_[1].sibling_pairs() != SiblingPairs::REQUIRE "
                                );
        S2LogMessageVoidify::operator&(&local_92,poVar5);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&dim);
      }
      for (local_b0 = 0; local_b0 < 3; local_b0 = local_b0 + 1) {
        pvVar4 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::
                 operator[](&this->graph_options_in_,(long)local_b0);
        S2Builder::GraphOptions::set_allow_vertex_filtering(pvVar4,false);
      }
      pvVar4 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::
               operator[](&this->graph_options_in_,1);
      S2Builder::GraphOptions::set_degenerate_edges(pvVar4,DISCARD_EXCESS);
      pvVar4 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::
               operator[](&this->graph_options_in_,2);
      S2Builder::GraphOptions::set_degenerate_edges(pvVar4,DISCARD_EXCESS);
      pvVar4 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::
               operator[](&this->graph_options_in_,2);
      S2Builder::GraphOptions::set_sibling_pairs(pvVar4,DISCARD_EXCESS);
      return;
    }
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_90);
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
}

Assistant:

ClosedSetNormalizer::ClosedSetNormalizer(
    const Options& options, const vector<GraphOptions>& graph_options_out)
    : options_(options),
      graph_options_out_(graph_options_out),
      graph_options_in_(graph_options_out_),
      sentinel_(std::numeric_limits<VertexId>::max(),
                std::numeric_limits<VertexId>::max()) {
  S2_DCHECK_EQ(graph_options_out_.size(), 3);
  S2_DCHECK(graph_options_out_[0].edge_type() == EdgeType::DIRECTED);
  S2_DCHECK(graph_options_out_[2].edge_type() == EdgeType::DIRECTED);

  // NOTE(ericv): Supporting these options would require some extra code in
  // order to handle undirected edges, and they are not useful for building
  // polylines anyway (they are intended for polygon meshes).
  S2_DCHECK(graph_options_out_[1].sibling_pairs() != SiblingPairs::CREATE);
  S2_DCHECK(graph_options_out_[1].sibling_pairs() != SiblingPairs::REQUIRE);

  // Set the GraphOptions for the input graphs to ensure that (1) they share a
  // common set of vertices, (2) degenerate edges are kept only if they are
  // isolated, and (3) multiple copies of siblings pairs are discarded.  (Note
  // that there may be multiple copies of isolated degenerate edges; clients
  // can eliminate them if desired using DuplicateEdges::MERGE.)
  for (int dim = 0; dim < 3; ++dim) {
    graph_options_in_[dim].set_allow_vertex_filtering(false);
  }
  graph_options_in_[1].set_degenerate_edges(DegenerateEdges::DISCARD_EXCESS);
  graph_options_in_[2].set_degenerate_edges(DegenerateEdges::DISCARD_EXCESS);
  graph_options_in_[2].set_sibling_pairs(SiblingPairs::DISCARD_EXCESS);
}